

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool trans_WFI(DisasContext_conflict1 *s,arg_WFI *a)

{
  TCGContext_conflict1 *tcg_ctx;
  undefined1 extraout_AL;
  
  tcg_ctx = s->uc->tcg_ctx;
  tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_movi_i32,(TCGArg)(tcg_ctx->cpu_R[0xf] + (long)tcg_ctx),
                      (long)(int)(s->base).pc_next);
  (s->base).is_jmp = DISAS_TARGET_2;
  return (_Bool)extraout_AL;
}

Assistant:

static bool trans_WFI(DisasContext *s, arg_WFI *a)
{
    /* For WFI, halt the vCPU until an IRQ. */
    gen_set_pc_im(s, s->base.pc_next);
    s->base.is_jmp = DISAS_WFI;
    return true;
}